

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void __thiscall QScroller::QScroller(QScroller *this,QObject *target)

{
  void *pvVar1;
  QScrollerPrivate *this_00;
  EVP_PKEY_CTX *in_RSI;
  QObject *in_RDI;
  QObject *unaff_retaddr;
  QScroller *in_stack_00000008;
  QScrollerPrivate *d;
  
  QObject::QObject(in_RDI,(QObject *)0x0);
  *(undefined ***)in_RDI = &PTR_metaObject_00d36890;
  pvVar1 = operator_new(0x1a8);
  QScrollerPrivate::QScrollerPrivate(d,in_stack_00000008,unaff_retaddr);
  *(void **)(in_RDI + 0x10) = pvVar1;
  QObject::setParent(in_RDI);
  this_00 = d_func((QScroller *)0xa80b09);
  QScrollerPrivate::init(this_00,in_RSI);
  return;
}

Assistant:

QScroller::QScroller(QObject *target)
    : d_ptr(new QScrollerPrivate(this, target))
{
    Q_ASSERT(target); // you can't create a scroller without a target in any normal way
    setParent(target);
    Q_D(QScroller);
    d->init();
}